

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O1

bool_t zzIsSumWEq_fast(word *b,word *a,size_t n,word w)

{
  size_t sVar1;
  
  if (n != 0) {
    sVar1 = 0;
    do {
      if (b[sVar1] != w + a[sVar1]) {
        return 0;
      }
      w = (word)(b[sVar1] < a[sVar1]);
      sVar1 = sVar1 + 1;
    } while (n != sVar1);
  }
  return (uint)(w == 0);
}

Assistant:

bool_t FAST(zzIsSumWEq)(const word b[], const word a[], size_t n, 
	register word w)
{
	size_t i;
	ASSERT(wwIsValid(a, n));
	ASSERT(wwIsValid(b, n));
	for (i = 0; i < n; ++i)
	{
		if (b[i] != (word)(a[i] + w))
		{
			w = 0;
			return FALSE;
		}
		w = b[i] < a[i];
	}
	return w == 0;
}